

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::GetLocalIPList_DNS(RTPUDPv4Transmitter *this)

{
  value_type local_428;
  int local_424;
  uint32_t ip;
  int j;
  int i;
  bool done;
  char name [1024];
  hostent *he;
  RTPUDPv4Transmitter *this_local;
  
  gethostname((char *)&i,0x3ff);
  name[0x3f7] = '\0';
  name._1016_8_ = gethostbyname((char *)&i);
  if ((hostent *)name._1016_8_ != (hostent *)0x0) {
    ip = 0;
    j._3_1_ = 0;
    while (((j._3_1_ ^ 0xff) & 1) != 0) {
      if (*(long *)(*(long *)(name._1016_8_ + 0x18) + (long)(int)ip * 8) == 0) {
        j._3_1_ = 1;
      }
      else {
        local_428 = 0;
        for (local_424 = 0; local_424 < 4; local_424 = local_424 + 1) {
          local_428 = (uint)*(byte *)(*(long *)(*(long *)(name._1016_8_ + 0x18) + (long)(int)ip * 8)
                                     + (long)local_424) <<
                      (('\x03' - (char)local_424) * '\b' & 0x1fU) | local_428;
        }
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->localIPs,&local_428);
        ip = ip + 1;
      }
    }
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::GetLocalIPList_DNS()
{
	struct hostent *he;
	char name[1024];
	bool done;
	int i,j;

	gethostname(name,1023);
	name[1023] = 0;
	he = gethostbyname(name);
	if (he == 0)
		return;
	
	i = 0;
	done = false;
	while (!done)
	{
		if (he->h_addr_list[i] == NULL)
			done = true;
		else
		{
			uint32_t ip = 0;

			for (j = 0 ; j < 4 ; j++)
				ip |= ((uint32_t)((unsigned char)he->h_addr_list[i][j])<<((3-j)*8));
			localIPs.push_back(ip);
			i++;
		}
	}
}